

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Secret_Input.H
# Opt level: O0

void __thiscall Fl_Secret_Input::~Fl_Secret_Input(Fl_Secret_Input *this)

{
  Fl_Secret_Input *this_local;
  
  ~Fl_Secret_Input(this);
  operator_delete(this,200);
  return;
}

Assistant:

class FL_EXPORT Fl_Secret_Input : public Fl_Input {
public:
  /**
    Creates a new Fl_Secret_Input widget using the given
    position, size, and label string. The default boxtype is FL_DOWN_BOX.

    Inherited destructor destroys the widget and any value associated with it.
  */
  Fl_Secret_Input(int X,int Y,int W,int H,const char *l = 0);
  int handle(int);
}